

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

bool __thiscall
cfd::core::TapBranch::FromString::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,string *text,TapBranch *branch)

{
  uint8_t leaf_version_00;
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  reference pcVar4;
  char *__nptr;
  long lVar5;
  CfdException *this_00;
  bool bVar6;
  Script local_298;
  TaprootScriptTree local_260;
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8;
  long local_1a8;
  long leaf_version;
  char *err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> leaf_ver_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> script_str;
  string local_148;
  Script local_128;
  TaprootScriptTree local_f0;
  long local_60;
  size_t leaf_ver_offset;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  string head;
  TapBranch *branch_local;
  string *text_local;
  anon_class_1_0_00000001 *this_local;
  
  head.field_2._8_8_ = branch;
  uVar3 = ::std::__cxx11::string::size();
  if (uVar3 < 6) {
    this_local._7_1_ = false;
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_48,(ulong)text);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"tl(");
    bVar6 = false;
    if (bVar1) {
      leaf_ver_offset = ::std::__cxx11::string::end();
      local_50 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&leaf_ver_offset,1);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      bVar6 = *pcVar4 == ')';
    }
    if (bVar6) {
      local_60 = ::std::__cxx11::string::find((char)text,0x2c);
      if (local_60 == -1) {
        ::std::__cxx11::string::length();
        ::std::__cxx11::string::substr((ulong)&local_148,(ulong)text);
        Script::Script(&local_128,&local_148);
        TaprootScriptTree::TaprootScriptTree(&local_f0,&local_128);
        TapBranch::operator=((TapBranch *)head.field_2._8_8_,&local_f0.super_TapBranch);
        TaprootScriptTree::~TaprootScriptTree(&local_f0);
        Script::~Script(&local_128);
        ::std::__cxx11::string::~string((string *)&local_148);
      }
      else {
        ::std::__cxx11::string::substr((ulong)((long)&leaf_ver_str.field_2 + 8),(ulong)text);
        ::std::__cxx11::string::substr((ulong)&err,(ulong)text);
        leaf_version = 0;
        __nptr = (char *)::std::__cxx11::string::c_str();
        lVar5 = strtol(__nptr,(char **)&leaf_version,0x10);
        local_1a8 = lVar5;
        if ((((leaf_version != 0) && (*(char *)leaf_version != '\0')) || (lVar5 < 0)) ||
           (bVar2 = ::std::numeric_limits<unsigned_char>::max(), (long)(ulong)bVar2 < lVar5)) {
          local_1ca = 1;
          this_00 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_1c8,"Invalid leaf version.",&local_1c9);
          CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_1c8);
          local_1ca = 0;
          __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
        }
        leaf_version_00 = (uint8_t)local_1a8;
        Script::Script(&local_298,(string *)((long)&leaf_ver_str.field_2 + 8));
        TaprootScriptTree::TaprootScriptTree(&local_260,leaf_version_00,&local_298);
        TapBranch::operator=((TapBranch *)head.field_2._8_8_,&local_260.super_TapBranch);
        TaprootScriptTree::~TaprootScriptTree(&local_260);
        Script::~Script(&local_298);
        ::std::__cxx11::string::~string((string *)&err);
        ::std::__cxx11::string::~string((string *)(leaf_ver_str.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    ::std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

TapBranch TapBranch::FromString(const std::string& text) {
  static auto check_tapleaf_func = [](const std::string& text,
                                      TapBranch* branch) -> bool {
    if (text.size() < 6) return false;
    std::string head = text.substr(0, 3);
    if ((head == "tl(") && (*(text.end() - 1) == ')')) {
      size_t leaf_ver_offset = text.find(',');
      if (leaf_ver_offset == std::string::npos) {
        *branch = TaprootScriptTree(Script(text.substr(3, text.length() - 4)));
      } else {
        auto script_str = text.substr(3, leaf_ver_offset - 3);
        auto leaf_ver_str = text.substr(leaf_ver_offset + 1, 2);
        char* err = nullptr;
        auto leaf_version = strtol(leaf_ver_str.c_str(), &err, 16);
        if (((err != nullptr) && (*err != '\0')) || (leaf_version < 0) ||
            (leaf_version > std::numeric_limits<uint8_t>::max())) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid leaf version.");
        }
        *branch = TaprootScriptTree(
            static_cast<uint8_t>(leaf_version), Script(script_str));
      }
      return true;
    }
    return false;
  };

  static auto analyze_func = [](const std::string& target) -> TapBranch {
    TapBranch result;
    if (*target.begin() == '{') {
      result = TapBranch::FromString(target);  // analyze branch
    } else if (!check_tapleaf_func(target, &result)) {
      result = TapBranch(ByteData256(target));
    }
    return result;
  };

  static auto collect_items_func =
      [](const std::string& text) -> std::vector<std::string> {
    std::vector<std::string> result;
    uint8_t depth = 0;
    size_t start_block_index = 0;
    size_t end_block_index = 0;
    size_t split_index = 0;
    for (size_t idx = 0; idx < text.size(); ++idx) {
      const char& str = text[idx];
      if (str == '{') {
        if (depth == 0) start_block_index = idx + 1;
        ++depth;
        if (depth == std::numeric_limits<uint8_t>::max()) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
      } else if (str == '}') {
        if (depth == 0) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
        --depth;
        if (depth == 0) {
          if (split_index == 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree format. empty split block.");
          }
          end_block_index = idx;
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if (end_block_index <= offset) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError, "Invalid tree item.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
        }
      } else if (str == ',') {
        if (depth == 1) {
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if ((offset + 3) < text.size()) {
            auto head = text.substr(offset, 3);
            char prev_str = 0;
            if (idx > 0) prev_str = text[idx - 1];
            // ignore leaf ver
            if ((head == "tl(") && (prev_str != ')')) continue;
          }

          if (split_index != 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree splitformat.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
          split_index = idx + 1;
        }
      }
    }

    if (result.empty()) {
      // do nothing
    } else if ((result.size() != 2) || ((end_block_index + 1) < text.size())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
    }
    return result;
  };

  if (text.find(' ') != std::string::npos) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Contains invalid charactor.");
  }

  TapBranch result;
  auto text_list = collect_items_func(text);
  if (text_list.empty()) {
    result = analyze_func(text);
  } else {
    auto branch1 = analyze_func(text_list.at(0));
    auto branch2 = analyze_func(text_list.at(1));
    if ((!branch1.has_leaf_) && (branch2.has_leaf_)) {
      branch2.AddBranch(branch1);
      result = branch2;
    } else {
      branch1.AddBranch(branch2);
      result = branch1;
    }
  }

  return result;
}